

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.h
# Opt level: O0

void __thiscall chatra::Reader::registerPointer<chatra::Lock>(Reader *this,Lock *ptr)

{
  reference pvVar1;
  value_type *p;
  Lock *ptr_local;
  Reader *this_local;
  
  std::vector<chatra::Reader::PointerInfo,_std::allocator<chatra::Reader::PointerInfo>_>::
  emplace_back<>(&this->pointerList);
  pvVar1 = std::vector<chatra::Reader::PointerInfo,_std::allocator<chatra::Reader::PointerInfo>_>::
           back(&this->pointerList);
  pvVar1->mode = Raw;
  pvVar1->raw = ptr;
  return;
}

Assistant:

void registerPointer(Type* ptr) {
		chatra_assert(ptr != nullptr);
		pointerList.emplace_back();
		auto& p = pointerList.back();
		p.mode = PointerMode::Raw;
		p.raw = ptr;
	}